

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall tcu::TestLog::TestLog(TestLog *this,char *fileName,deUint32 flags)

{
  qpTestLog *pqVar1;
  ResourceError *this_00;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pqVar1 = qpTestLog_createFileLog(fileName,flags);
  this->m_log = pqVar1;
  if (pqVar1 != (qpTestLog *)0x0) {
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Failed to open test log file \'",&local_79);
  std::operator+(&local_58,&local_78,fileName);
  std::operator+(&local_38,&local_58,"\'");
  ResourceError::ResourceError(this_00,&local_38);
  __cxa_throw(this_00,&ResourceError::typeinfo,Exception::~Exception);
}

Assistant:

TestLog::TestLog (const char* fileName, deUint32 flags)
	: m_log(qpTestLog_createFileLog(fileName, flags))
{
	if (!m_log)
		throw ResourceError(std::string("Failed to open test log file '") + fileName + "'");
}